

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcsrc.cpp
# Opt level: O2

CTcSrcFile * CTcSrcFile::open_ascii(char *filename)

{
  FILE *fp;
  CTcSrcFile *this;
  CCharmapToUni *mapper;
  
  fp = fopen(filename,"rb");
  if (fp == (FILE *)0x0) {
    this = (CTcSrcFile *)0x0;
  }
  else {
    this = (CTcSrcFile *)operator_new(0x430);
    mapper = (CCharmapToUni *)operator_new(0x210);
    memset(mapper,0,0x210);
    (mapper->super_CCharmap).ref_cnt_ = 1;
    (mapper->super_CCharmap)._vptr_CCharmap = (_func_int **)&PTR__CCharmap_003040d8;
    CTcSrcFile(this,(osfildef *)fp,mapper);
  }
  return this;
}

Assistant:

CTcSrcFile *CTcSrcFile::open_ascii(const char *filename)
{
    osfildef *fp;

    /* 
     *   open the file in binary mode, since we do all of the newline
     *   interpretation explicitly 
     */
    if ((fp = osfoprb(filename, OSFTTEXT)) == 0)
        return 0;

    /* return a source reader with a plain ASCII mapper */
    return new CTcSrcFile(fp, new CCharmapToUniASCII());
}